

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O3

Vector3d * __thiscall
VehicleState::Propagator::GetAccelVector(Vector3d *__return_storage_ptr__,Propagator *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[0];
  dVar5 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1];
  dVar1 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2];
  dVar2 = this->mu_;
  dVar6 = pow(SQRT(dVar1 * dVar1 + dVar5 * dVar5 + dVar4 * dVar4),3.0);
  dVar6 = -dVar2 / dVar6;
  auVar3._8_4_ = SUB84(dVar6 * dVar5,0);
  auVar3._0_8_ = dVar6 * dVar4;
  auVar3._12_4_ = (int)((ulong)(dVar6 * dVar5) >> 0x20);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar1 * dVar6;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d Propagator::GetAccelVector(){

		//extract locals
		double mu = this->mu_;
		Eigen::Vector3d pos = this->pos_;

		//radius
		double R = sqrt(pow(pos[0],2) + pow(pos[1],2) + pow(pos[2],2));

		//create accel vector
		Eigen::Vector3d accel = -1.0*mu/pow(R,3)*pos;

		//return
		return accel;


	}